

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall cmGeneratorTarget::NeedRelinkBeforeInstall(cmGeneratorTarget *this,string *config)

{
  _Base_ptr p_Var1;
  TargetType TVar2;
  cmMakefile *this_00;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  LinkClosure *pLVar7;
  ostream *poVar8;
  cmake *this_01;
  string ll;
  string flagVar;
  undefined1 auStack_1f8 [16];
  cmLocalGenerator *local_1e8;
  cmGlobalGenerator *local_1e0;
  undefined1 local_1d8 [48];
  undefined1 local_1a8 [16];
  _Rb_tree_node_base local_198 [3];
  ios_base local_138 [264];
  
  TVar2 = this->Target->TargetTypeValue;
  if (MODULE_LIBRARY < TVar2) {
    return false;
  }
  if (TVar2 == STATIC_LIBRARY) {
    return false;
  }
  if (this->Target->HaveInstallRule != true) {
    return false;
  }
  this_00 = this->Makefile;
  p_Var1 = (_Base_ptr)(local_1a8 + 0x10);
  local_1a8._0_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_SKIP_RPATH","");
  bVar4 = cmMakefile::IsOn(this_00,(string *)local_1a8);
  if ((_Base_ptr)local_1a8._0_8_ != p_Var1) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._0_8_ + 1));
  }
  if (bVar4) {
    return false;
  }
  local_1a8._0_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"BUILD_WITH_INSTALL_RPATH","")
  ;
  bVar4 = cmTarget::GetPropertyAsBool(this->Target,(string *)local_1a8);
  if ((_Base_ptr)local_1a8._0_8_ != p_Var1) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._0_8_ + 1));
  }
  if (bVar4) {
    return false;
  }
  bVar4 = IsChrpathUsed(this,config);
  if (bVar4) {
    return false;
  }
  pLVar7 = GetLinkClosure(this,config);
  pcVar3 = (pLVar7->LinkerLanguage)._M_dataplus._M_p;
  local_1e8 = (cmLocalGenerator *)local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar3,pcVar3 + (pLVar7->LinkerLanguage)._M_string_length);
  if (local_1e0 != (cmGlobalGenerator *)0x0) {
    local_1a8._0_8_ = p_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CMAKE_SHARED_LIBRARY_RUNTIME_","");
    std::__cxx11::string::_M_append(local_1a8,(ulong)local_1e8);
    std::__cxx11::string::append(local_1a8);
    bVar4 = cmMakefile::IsSet(this->Makefile,(string *)local_1a8);
    if ((_Base_ptr)local_1a8._0_8_ != p_Var1) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._0_8_ + 1));
    }
    if (bVar4) {
      bVar4 = HaveBuildTreeRPATH(this,config);
      bVar5 = true;
      if (!bVar4) {
        bVar5 = HaveInstallTreeRPATH(this);
      }
      (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_1a8);
      iVar6 = std::__cxx11::string::compare(local_1a8);
      if ((_Base_ptr)local_1a8._0_8_ != p_Var1) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._0_8_ + 1));
      }
      if (bVar5 == true && iVar6 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The install of the ",0x13);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(this->Target->Name)._M_dataplus._M_p,
                            (this->Target->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   " target requires changing an RPATH from the build tree, but this is not supported with the Ninja generator unless on an ELF-based platform.  The CMAKE_BUILD_WITH_INSTALL_RPATH variable may be set to avoid this relinking step."
                   ,0xe1);
        this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        std::__cxx11::stringbuf::str();
        GetBacktrace((cmGeneratorTarget *)auStack_1f8);
        cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_1d8 + 0x10),
                            (cmListFileBacktrace *)auStack_1f8);
        if ((cmMakefile *)auStack_1f8._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1f8._8_8_);
        }
        if ((undefined1 *)local_1d8._16_8_ != local_1d8 + 0x20) {
          operator_delete((void *)local_1d8._16_8_,local_1d8._32_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar5 = true;
      }
      goto LAB_002ba656;
    }
  }
  bVar5 = false;
LAB_002ba656:
  if (local_1e8 != (cmLocalGenerator *)local_1d8) {
    operator_delete(local_1e8,(ulong)(local_1d8._0_8_ + 1));
    return bVar5;
  }
  return bVar5;
}

Assistant:

cmStateEnums::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}